

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_asn1.cc
# Opt level: O0

int RSA_public_key_to_bytes(uint8_t **out_bytes,size_t *out_len,RSA *rsa)

{
  int iVar1;
  undefined1 local_58 [8];
  CBB cbb;
  RSA *rsa_local;
  size_t *out_len_local;
  uint8_t **out_bytes_local;
  
  cbb.u._24_8_ = rsa;
  CBB_zero((CBB *)local_58);
  iVar1 = CBB_init((CBB *)local_58,0);
  if (((iVar1 != 0) &&
      (iVar1 = RSA_marshal_public_key((CBB *)local_58,(RSA *)cbb.u._24_8_), iVar1 != 0)) &&
     (iVar1 = CBB_finish((CBB *)local_58,out_bytes,out_len), iVar1 != 0)) {
    return 1;
  }
  ERR_put_error(4,0,0x79,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_asn1.cc"
                ,0x68);
  CBB_cleanup((CBB *)local_58);
  return 0;
}

Assistant:

int RSA_public_key_to_bytes(uint8_t **out_bytes, size_t *out_len,
                            const RSA *rsa) {
  CBB cbb;
  CBB_zero(&cbb);
  if (!CBB_init(&cbb, 0) ||
      !RSA_marshal_public_key(&cbb, rsa) ||
      !CBB_finish(&cbb, out_bytes, out_len)) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_ENCODE_ERROR);
    CBB_cleanup(&cbb);
    return 0;
  }
  return 1;
}